

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

bool soplex::LPFhasKeyword(char **pos,char *keyword)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  
  pcVar3 = *pos;
  iVar10 = 0;
  iVar11 = 0;
  do {
    lVar8 = (long)iVar10;
    cVar2 = keyword[lVar8];
    if (cVar2 == '[') {
      pcVar5 = keyword + (iVar10 + 1);
      lVar12 = 0;
      iVar6 = iVar10;
      do {
        iVar10 = iVar6;
        pcVar13 = pcVar5;
        cVar2 = pcVar3[lVar12 + iVar11];
        iVar7 = tolower((int)cVar2);
        lVar1 = lVar12 + 1;
        if (cVar2 == '\0') break;
        lVar4 = lVar12 + lVar8 + 1;
        pcVar5 = pcVar13 + 1;
        lVar12 = lVar1;
        iVar6 = iVar10 + 1;
      } while (iVar7 == keyword[lVar4]);
      do {
        iVar10 = iVar10 + 1;
        cVar2 = *pcVar13;
        pcVar13 = pcVar13 + 1;
      } while (cVar2 != ']');
      iVar11 = iVar11 + (int)lVar1 + -2;
    }
    else {
      if (cVar2 == '\0') {
        bVar9 = pcVar3[iVar11];
        goto LAB_0017a20b;
      }
      bVar9 = pcVar3[iVar11];
      iVar6 = tolower((int)(char)bVar9);
      if (iVar6 != cVar2) {
        if (cVar2 == '\0') {
LAB_0017a20b:
          if (((bVar9 < 0x21) && ((0x100002601U >> ((ulong)bVar9 & 0x3f) & 1) != 0)) ||
             ((byte)(bVar9 - 0x3c) < 3)) {
            *pos = pcVar3 + iVar11;
            return true;
          }
        }
        return false;
      }
    }
    iVar10 = iVar10 + 1;
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

static inline bool LPFhasKeyword(char*& pos, const char* keyword)
{
   int i;
   int k;

   assert(keyword != nullptr);

   for(i = 0, k = 0; keyword[i] != '\0'; i++, k++)
   {
      if(keyword[i] == '[')
      {
         i++;

         // Here we assumed that we have a ']' for the '['.
         while((tolower(pos[k]) == keyword[i]) && (pos[k] != '\0'))
         {
            k++;
            i++;
         }

         while(keyword[i] != ']')
            i++;

         --k;
      }
      else
      {
         if(keyword[i] != tolower(pos[k]))
            break;
      }
   }

   // we have to be at the end of the keyword and the word found on the line also has to end here.  Attention: The
   // LPFisSense is a kludge to allow LPFhasKeyword also to process Inf[inity] keywords in the bounds section.
   if(keyword[i] == '\0' && (pos[k] == '\0' || LPFisSpace(pos[k]) || LPFisSense(&pos[k])))
   {
      pos += k;

      return true;
   }

   return false;
}